

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
toml::Value::ValueConverter<std::vector<int,_std::allocator<int>_>_>::to
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          ValueConverter<std::vector<int,_std::allocator<int>_>_> *this,Value *v)

{
  Value *this_00;
  pointer pVVar1;
  return_type_conflict rVar2;
  undefined8 in_RAX;
  return_type pvVar3;
  Value *element;
  pointer this_01;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  pvVar3 = as<std::vector<toml::Value,std::allocator<toml::Value>>>(v);
  this_00 = (pvVar3->super__Vector_base<toml::Value,_std::allocator<toml::Value>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (this_00 ==
      (pvVar3->super__Vector_base<toml::Value,_std::allocator<toml::Value>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    assureType<int>(this_00);
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pVVar1 = (pvVar3->super__Vector_base<toml::Value,_std::allocator<toml::Value>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (this_01 = (pvVar3->super__Vector_base<toml::Value,_std::allocator<toml::Value>_>)._M_impl.
                   super__Vector_impl_data._M_start; this_01 != pVVar1; this_01 = this_01 + 1) {
      rVar2 = as<int>(this_01);
      uStack_28 = CONCAT44(rVar2,(undefined4)uStack_28);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                (__return_storage_ptr__,(int *)((long)&uStack_28 + 4));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> to(const Value& v)
    {
        const Array& array = v.as<Array>();
        if (array.empty())
            return std::vector<T>();
        array.front().assureType<T>();

        std::vector<T> result;
        for (const auto& element : array) {
            result.push_back(element.as<T>());
        }

        return result;
    }